

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yymatchClass(GREG *G,uchar *bits,char *cclass)

{
  int iVar1;
  
  if (((G->pos < G->limit) || (iVar1 = yyrefill(G), iVar1 != 0)) &&
     ((bits[(byte)G->buf[G->pos] >> 3] >> ((byte)G->buf[G->pos] & 7) & 1) != 0)) {
    G->pos = G->pos + 1;
    return 1;
  }
  return 0;
}

Assistant:

YY_LOCAL(int) yymatchClass(GREG *G, const unsigned char *bits, const char *cclass)
{
  int c;
  if (G->pos >= G->limit && !yyrefill(G)) return 0;
  c= (unsigned char)G->buf[G->pos];
  if (bits[c >> 3] & (1 << (c & 7)))
    {
      ++G->pos;
      yyprintf((stderr, "  ok   yymatchClass [%s]", cclass));
      yyprintfGcontext;
      yyprintf((stderr, "\n"));
      return 1;
    }
  yyprintfv((stderr, "  fail yymatchClass [%s]", cclass));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));
  return 0;
}